

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::cxx::GlobalAssignDescriptorsName
                   (string *__return_storage_ptr__,string *filename)

{
  string local_30;
  
  FilenameIdentifier(&local_30,filename);
  std::operator+(__return_storage_ptr__,"protobuf_AssignDesc_",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string GlobalAssignDescriptorsName(const string& filename) {
  return "protobuf_AssignDesc_" + FilenameIdentifier(filename);
}